

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall backend::codegen::RegAllocator::alloc_regs(RegAllocator *this)

{
  bool bVar1;
  ostream *poVar2;
  reference ppVar3;
  void *this_00;
  reference puVar4;
  element_type *peVar5;
  size_type sVar6;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_01;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar7;
  RegAllocator *in_stack_00000010;
  PushPopInst *last__1;
  value_type *last_1;
  PushPopInst *first__1;
  value_type *first_1;
  size_type offset_size;
  bool use_stack_param;
  uint r_3;
  iterator __end2_4;
  iterator __begin2_4;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_4;
  uint r_2;
  iterator __end2_3;
  iterator __begin2_3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_3;
  PushPopInst *last_;
  value_type *last;
  uint r_1;
  iterator __end2_2;
  iterator __begin2_2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_2;
  uint r;
  iterator __end2_1;
  iterator __begin2_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_1;
  PushPopInst *first_;
  value_type *first;
  pair<const_int,_unsigned_int> x;
  iterator __end2;
  iterator __begin2;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *__range2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffff918;
  Function *in_stack_fffffffffffff920;
  const_iterator in_stack_fffffffffffff928;
  Function *in_stack_fffffffffffff930;
  const_iterator in_stack_fffffffffffff938;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffff940;
  Function *in_stack_fffffffffffff948;
  Tag *in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff960;
  Operand2 *in_stack_fffffffffffff978;
  Operand2 *in_stack_fffffffffffff980;
  OpCode *in_stack_fffffffffffff988;
  uint *in_stack_fffffffffffff990;
  OpCode *in_stack_fffffffffffff998;
  Timestamp *in_stack_fffffffffffff9a8;
  ostream *in_stack_fffffffffffff9b0;
  ostream *in_stack_fffffffffffffa18;
  ostream *in_stack_fffffffffffffa20;
  unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> local_508 [4];
  undefined4 local_4e4;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_4d0;
  undefined8 local_4c8;
  undefined8 in_stack_fffffffffffffb40;
  Operand2 local_448;
  undefined4 local_428;
  undefined4 local_424;
  OpCode local_420 [2];
  OpCode local_418 [2];
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_410;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_408;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_3f8;
  undefined4 local_3cc;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_3b8;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_3b0;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_3a0;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_398;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_390;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_380;
  undefined4 local_354;
  RegAllocator *in_stack_fffffffffffffcb0;
  _Self local_300;
  _Self local_2f8;
  long *local_2f0;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  uint local_2d4;
  _Self local_2d0;
  _Self local_2c8;
  long *local_2c0;
  type local_2b8;
  reference local_2b0;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  uint local_294;
  _Self local_290;
  _Self local_288;
  long *local_280;
  _Base_ptr local_278;
  undefined1 local_270;
  uint local_264;
  _Self local_260;
  _Self local_258;
  long *local_250;
  type local_248;
  reference local_240;
  ostream local_231;
  string local_230 [32];
  RegAllocator *in_stack_fffffffffffffdf0;
  string local_208 [120];
  time_point_sys_clock local_190;
  Timestamp local_188 [3];
  undefined1 local_139;
  pair<const_int,_unsigned_int> local_138;
  _Self local_130;
  _Self local_128;
  long *local_120;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [120];
  time_point_sys_clock local_70;
  Timestamp local_68 [3];
  undefined1 local_9;
  
  construct_reg_map(in_stack_fffffffffffffdf0);
  calc_live_intervals(in_stack_fffffffffffffcb0);
  local_9 = 0;
  AixLog::operator<<(in_stack_fffffffffffffa20,(Severity *)in_stack_fffffffffffffa18);
  AixLog::Tag::Tag(in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff950,(Tag *)in_stack_fffffffffffff948);
  local_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_68,&local_70);
  AixLog::operator<<(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958,
             (allocator<char> *)in_stack_fffffffffffff950);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958,
             (allocator<char> *)in_stack_fffffffffffff950);
  AixLog::Function::Function
            (in_stack_fffffffffffff930,(string *)in_stack_fffffffffffff928._M_current,
             (string *)in_stack_fffffffffffff920,(size_t)in_stack_fffffffffffff918);
  poVar2 = AixLog::operator<<((ostream *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  poVar2 = std::operator<<(poVar2,"BB starting point");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function(in_stack_fffffffffffff920);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  AixLog::Timestamp::~Timestamp(local_68);
  AixLog::Tag::~Tag((Tag *)0x235cbb);
  local_120 = in_RDI + 0x16;
  local_128._M_node =
       (_Base_ptr)
       std::
       map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
       ::begin((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                *)in_stack_fffffffffffff918);
  local_130._M_node =
       (_Base_ptr)
       std::
       map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
       ::end((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
              *)in_stack_fffffffffffff918);
  while (bVar1 = std::operator!=(&local_128,&local_130), bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_unsigned_int>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_int,_unsigned_int>_> *)0x235d26);
    local_138 = *ppVar3;
    local_139 = 0;
    AixLog::operator<<(in_stack_fffffffffffffa20,(Severity *)in_stack_fffffffffffffa18);
    AixLog::Tag::Tag(in_stack_fffffffffffff950,(char *)in_stack_fffffffffffff948);
    AixLog::operator<<((ostream *)in_stack_fffffffffffff950,(Tag *)in_stack_fffffffffffff948);
    local_190.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_188,&local_190);
    AixLog::operator<<(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (allocator<char> *)in_stack_fffffffffffff950);
    in_stack_fffffffffffffa20 = &local_231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (allocator<char> *)in_stack_fffffffffffff950);
    AixLog::Function::Function
              (in_stack_fffffffffffff930,(string *)in_stack_fffffffffffff928._M_current,
               (string *)in_stack_fffffffffffff920,(size_t)in_stack_fffffffffffff918);
    in_stack_fffffffffffffa18 =
         AixLog::operator<<((ostream *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    poVar2 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffa18,local_138.first);
    poVar2 = std::operator<<(poVar2," -> ");
    this_00 = (void *)std::ostream::operator<<(poVar2,local_138.second);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_fffffffffffff920);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdf7);
    AixLog::Timestamp::~Timestamp(local_188);
    AixLog::Tag::~Tag((Tag *)0x235f47);
    std::_Rb_tree_iterator<std::pair<const_int,_unsigned_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_unsigned_int>_> *)in_stack_fffffffffffff920);
  }
  calc_reg_affinity((RegAllocator *)in_stack_fffffffffffffb40);
  perform_load_stores(in_stack_00000010);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::operator=((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               *)in_stack_fffffffffffff930,
              (vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               *)in_stack_fffffffffffff928._M_current);
  local_240 = std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::front((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       *)in_stack_fffffffffffff920);
  local_248 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                        ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                         in_stack_fffffffffffff920);
  local_250 = in_RDI + 3;
  local_258._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_fffffffffffff918);
  local_260._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 (in_stack_fffffffffffff918);
  while (bVar1 = std::operator!=(&local_258,&local_260), bVar1) {
    puVar4 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x2361fb);
    local_264 = *puVar4;
    pVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938._M_current)
    ;
    local_278 = (_Base_ptr)pVar7.first._M_node;
    local_270 = pVar7.second;
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_fffffffffffff920);
  }
  local_280 = in_RDI + 9;
  local_288._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_fffffffffffff918);
  local_290._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 (in_stack_fffffffffffff918);
  while (bVar1 = std::operator!=(&local_288,&local_290), bVar1) {
    puVar4 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x2362a1);
    local_294 = *puVar4;
    pVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938._M_current)
    ;
    local_2a8 = (_Base_ptr)pVar7.first._M_node;
    local_2a0 = pVar7.second;
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_fffffffffffff920);
  }
  local_2b0 = std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      *)in_stack_fffffffffffff920);
  local_2b8 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
                        ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                         in_stack_fffffffffffff920);
  local_2c0 = in_RDI + 3;
  local_2c8._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_fffffffffffff918);
  local_2d0._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 (in_stack_fffffffffffff918);
  while (bVar1 = std::operator!=(&local_2c8,&local_2d0), bVar1) {
    puVar4 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x23637b);
    local_2d4 = *puVar4;
    pVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938._M_current)
    ;
    local_2e8 = (_Base_ptr)pVar7.first._M_node;
    local_2e0 = pVar7.second;
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_fffffffffffff920);
  }
  local_2f0 = in_RDI + 9;
  local_2f8._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_fffffffffffff918);
  local_300._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 (in_stack_fffffffffffff918);
  while (bVar1 = std::operator!=(&local_2f8,&local_300), bVar1) {
    std::_Rb_tree_const_iterator<unsigned_int>::operator*
              ((_Rb_tree_const_iterator<unsigned_int> *)0x236421);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (in_stack_fffffffffffff940,(value_type *)in_stack_fffffffffffff938._M_current);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_fffffffffffff920);
  }
  peVar5 = std::__shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2> *)
                      (*in_RDI + 0x78));
  sVar6 = std::
          vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
          ::size(&peVar5->params);
  bVar1 = 4 < sVar6;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x2364a2);
  if ((!bVar1) && ((int)in_RDI[0x7b] == 0)) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               in_stack_fffffffffffff920,(key_type_conflict *)in_stack_fffffffffffff918);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               in_stack_fffffffffffff920,(key_type_conflict *)in_stack_fffffffffffff918);
  }
  if (bVar1) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)in_stack_fffffffffffff918);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                 *)in_stack_fffffffffffff928._M_current,(difference_type)in_stack_fffffffffffff920);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
    ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
              ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff920,
               (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff918);
    local_354 = 9;
    arm::Operand2::Operand2
              ((Operand2 *)in_stack_fffffffffffff920,
               (int32_t)((ulong)in_stack_fffffffffffff918 >> 0x20));
    std::
    make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int_const&,unsigned_int_const&,arm::Operand2>
              (in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               in_stack_fffffffffffff980);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff928._M_current);
    local_380 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::insert((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                          *)in_stack_fffffffffffff920,in_stack_fffffffffffff928,
                         (value_type *)in_stack_fffffffffffff918);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff920);
  }
  if ((int)in_RDI[0x7b] == 0) {
    if (!bVar1) {
      local_398 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                  std::
                  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                           *)in_stack_fffffffffffff918);
      local_390 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                  __gnu_cxx::
                  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                  ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                               *)in_stack_fffffffffffff928._M_current,
                              (difference_type)in_stack_fffffffffffff920);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
      ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
                ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                  *)in_stack_fffffffffffff920,
                 (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                  *)in_stack_fffffffffffff918);
      local_3a0 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                  std::
                  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  ::erase((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                           *)in_stack_fffffffffffff930,in_stack_fffffffffffff938);
    }
  }
  else if ((int)in_RDI[0x7b] < 0x400) {
    local_3b8 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                         *)in_stack_fffffffffffff918);
    local_3b0 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                             *)in_stack_fffffffffffff928._M_current,
                            (difference_type)in_stack_fffffffffffff920);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
    ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
              ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff920,
               (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff918);
    local_3cc = 10;
    arm::Operand2::Operand2
              ((Operand2 *)in_stack_fffffffffffff920,
               (int32_t)((ulong)in_stack_fffffffffffff918 >> 0x20));
    std::
    make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int_const&,unsigned_int_const&,arm::Operand2>
              (in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               in_stack_fffffffffffff980);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff928._M_current);
    local_3f8 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::insert((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                          *)in_stack_fffffffffffff920,in_stack_fffffffffffff928,
                         (value_type *)in_stack_fffffffffffff918);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff920);
  }
  else {
    in_stack_fffffffffffff990 = (uint *)(*in_RDI + 0x28);
    local_410 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                         *)in_stack_fffffffffffff918);
    local_408 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                             *)in_stack_fffffffffffff928._M_current,
                            (difference_type)in_stack_fffffffffffff920);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
    ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
              ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff920,
               (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff918);
    local_424 = 6;
    local_428 = 0xc;
    in_stack_fffffffffffff980 = &local_448;
    arm::Operand2::Operand2
              ((Operand2 *)in_stack_fffffffffffff920,
               (int32_t)((ulong)in_stack_fffffffffffff918 >> 0x20));
    in_stack_fffffffffffff988 = local_420;
    std::make_unique<arm::Arith2Inst,arm::OpCode,int,arm::Operand2>
              (in_stack_fffffffffffff988,(int *)in_stack_fffffffffffff980,in_stack_fffffffffffff978)
    ;
    in_stack_fffffffffffff998 = local_418;
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930,
               (unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
               in_stack_fffffffffffff928._M_current);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::insert((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              *)in_stack_fffffffffffff920,in_stack_fffffffffffff928,
             (value_type *)in_stack_fffffffffffff918);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930);
    std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
               in_stack_fffffffffffff920);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)in_stack_fffffffffffff918);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                 *)in_stack_fffffffffffff928._M_current,(difference_type)in_stack_fffffffffffff920);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
    ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
              ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff920,
               (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff918);
    arm::RegisterOperand::RegisterOperand
              ((RegisterOperand *)in_stack_fffffffffffff920,
               (Reg)((ulong)in_stack_fffffffffffff918 >> 0x20));
    std::
    make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int_const&,unsigned_int_const&,arm::RegisterOperand>
              (in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               (RegisterOperand *)in_stack_fffffffffffff980);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff928._M_current);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::insert((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              *)in_stack_fffffffffffff920,in_stack_fffffffffffff928,
             (value_type *)in_stack_fffffffffffff918);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff920);
  }
  if ((int)in_RDI[0x7b] == 0) {
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           *)in_stack_fffffffffffff918);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator-((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                 *)in_stack_fffffffffffff928._M_current,(difference_type)in_stack_fffffffffffff920);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
    ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
              ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff920,
               (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff918);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::erase((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)in_stack_fffffffffffff930,in_stack_fffffffffffff938);
  }
  if (bVar1) {
    in_stack_fffffffffffff938._M_current =
         (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)(*in_RDI + 0x28);
    local_4d0 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       *)in_stack_fffffffffffff918);
    local_4c8 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                ::operator-((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                             *)in_stack_fffffffffffff928._M_current,
                            (difference_type)in_stack_fffffffffffff920);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
    ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
              ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff920,
               (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff918);
    local_4e4 = 10;
    in_stack_fffffffffffff928._M_current =
         (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)local_508;
    arm::Operand2::Operand2
              ((Operand2 *)in_stack_fffffffffffff920,
               (int32_t)((ulong)in_stack_fffffffffffff918 >> 0x20));
    in_stack_fffffffffffff930 = (Function *)&stack0xfffffffffffffb20;
    std::
    make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int_const&,unsigned_int_const&,arm::Operand2>
              (in_stack_fffffffffffff998,in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               in_stack_fffffffffffff980);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith3Inst,std::default_delete<arm::Arith3Inst>,void>
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930,
               (unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff928._M_current);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::insert((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              *)in_stack_fffffffffffff920,in_stack_fffffffffffff928,
             (value_type *)in_stack_fffffffffffff918);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff930);
    std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)
               in_stack_fffffffffffff920);
  }
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::front((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           *)in_stack_fffffffffffff920);
  std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
            ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff920);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          *)in_stack_fffffffffffff920);
  std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator*
            ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffff920);
  bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     0x236d06);
  if (bVar1) {
    in_stack_fffffffffffff920 = (Function *)(*in_RDI + 0x28);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)in_stack_fffffffffffff918);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
    ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
              ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff920,
               (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff918);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::erase((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)in_stack_fffffffffffff930,in_stack_fffffffffffff938);
  }
  bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     0x236d74);
  if (bVar1) {
    this_01 = (vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               *)(*in_RDI + 0x28);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::end(this_01);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator-((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                 *)in_stack_fffffffffffff928._M_current,(difference_type)in_stack_fffffffffffff920);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
    ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
              ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)in_stack_fffffffffffff920,
               (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                *)this_01);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::erase((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)in_stack_fffffffffffff930,in_stack_fffffffffffff938);
  }
  return;
}

Assistant:

void RegAllocator::alloc_regs() {
  construct_reg_map();
  calc_live_intervals();

  LOG(TRACE, "bb_reg_use") << "BB starting point" << std::endl;
  for (auto x : point_bb_map) {
    LOG(TRACE, "bb_reg_use") << x.first << " -> " << x.second << std::endl;
  }

  // LOG(TRACE, "bb_reg_use") << "BB Reg use:" << std::endl;
  // for (auto x : bb_used_regs) {
  //   LOG(TRACE, "bb_reg_use") << x.first << " -> ";
  //   for (auto r : x.second) {
  //     display_reg_name(LOG(TRACE, "color_map"), r);
  //     LOG(TRACE, "bb_reg_use") << " ";
  //   }
  //   LOG(TRACE, "bb_reg_use") << std::endl;
  // }
  calc_reg_affinity();

  perform_load_stores();
  f.inst = std::move(inst_sink);

  {
    // Add used reg stuff
    auto &first = f.inst.front();
    auto first_ = static_cast<PushPopInst *>(&*first);
    for (auto r : used_regs) first_->regs.insert(r);
    for (auto r : used_regs_temp) first_->regs.insert(r);
    auto &last = f.inst.back();
    auto last_ = static_cast<PushPopInst *>(&*last);
    for (auto r : used_regs) last_->regs.insert(r);
    for (auto r : used_regs_temp) last_->regs.insert(r);

    auto use_stack_param = f.ty.get()->params.size() > 4;
    auto offset_size = (first_->regs.size()) * 4;

    if (!use_stack_param && stack_size == 0) {
      first_->regs.erase(REG_FP);
      last_->regs.erase(REG_FP);
    }

    if (use_stack_param) {
      f.inst.insert(f.inst.begin() + 2,
                    std::make_unique<Arith3Inst>(OpCode::Add, REG_FP, REG_FP,
                                                 Operand2(offset_size)));
    }

    if (stack_size == 0) {
      // sp does not change.
      if (!use_stack_param) {
        // no need to use fp
        f.inst.erase(f.inst.begin() + 1);
      }
    } else if (stack_size < 1024) {
      f.inst.insert(f.inst.begin() + 2,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_SP, REG_SP,
                                                 Operand2(stack_size)));
    } else {
      f.inst.insert(
          f.inst.begin() + 2,
          std::make_unique<Arith2Inst>(OpCode::Mov, 12, Operand2(stack_size)));
      f.inst.insert(f.inst.begin() + 3,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_SP, REG_SP,
                                                 RegisterOperand(12)));
    }

    if (stack_size == 0) {
      // sp hasn't change throught function
      f.inst.erase(f.inst.end() - 2);
    }

    if (use_stack_param) {
      f.inst.insert(f.inst.end() - 2,
                    std::make_unique<Arith3Inst>(OpCode::Sub, REG_FP, REG_FP,
                                                 Operand2(offset_size)));
    }
    {
      auto &first = f.inst.front();
      auto first_ = static_cast<PushPopInst *>(&*first);
      auto &last = f.inst.back();
      auto last_ = static_cast<PushPopInst *>(&*last);
      if (first_->regs.empty()) f.inst.erase(f.inst.begin());
      if (last_->regs.empty()) f.inst.erase(f.inst.end() - 1);
    }
  }
}